

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

type_info * pybind11::detail::get_type_info(type_info *tp,bool throw_if_missing)

{
  internals *this;
  iterator iVar1;
  type_info *ptVar2;
  long *plVar3;
  size_type *psVar4;
  string tname;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = get_internals();
  local_58._M_dataplus._M_p = (pointer)tp;
  iVar1 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)&local_58);
  if (iVar1.super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    if (throw_if_missing) {
      std::__cxx11::string::string
                ((string *)&local_58,*(char **)(tp + 8) + (**(char **)(tp + 8) == '*'),
                 (allocator *)&local_78);
      clean_type_id(&local_58);
      std::operator+(&local_38,"pybind11::detail::get_type_info: unable to find type info for \"",
                     &local_58);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
      local_78._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_78._M_dataplus._M_p == psVar4) {
        local_78.field_2._M_allocated_capacity = *psVar4;
        local_78.field_2._8_8_ = plVar3[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar4;
      }
      local_78._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      pybind11_fail(&local_78);
    }
    ptVar2 = (type_info *)0x0;
  }
  else {
    ptVar2 = *(type_info **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>.
                     _M_cur + 0x10);
  }
  return ptVar2;
}

Assistant:

PYBIND11_NOINLINE inline detail::type_info *get_type_info(const std::type_info &tp,
                                                          bool throw_if_missing = false) {
    auto &types = get_internals().registered_types_cpp;

    auto it = types.find(std::type_index(tp));
    if (it != types.end())
        return (detail::type_info *) it->second;
    if (throw_if_missing) {
        std::string tname = tp.name();
        detail::clean_type_id(tname);
        pybind11_fail("pybind11::detail::get_type_info: unable to find type info for \"" + tname + "\"");
    }
    return nullptr;
}